

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O3

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>,_1,_1,false>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,3,1>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,_1,1,false>const>,Eigen::Map<Eigen::Matrix<double,1,_1,1,1,3>,0,Eigen::Stride<0,0>>,1>,Eigen::internal::sub_assign_op<double,double>>
               (Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>
                *dst,Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>
                     *src,sub_assign_op<double,_double> *func)

{
  double dVar1;
  double *pdVar2;
  ulong uVar3;
  double dVar4;
  Index size;
  Index index_1;
  ulong uVar5;
  Index index;
  ulong uVar6;
  ulong uVar7;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  Kernel kernel;
  SrcEvaluatorType local_98;
  DstEvaluatorType local_30;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>_>,_Eigen::internal::sub_assign_op<double,_double>,_0>
  local_20;
  
  local_98.
  super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows = 0;
  dVar1 = (src->m_lhs).m_lhs.m_functor.m_other;
  pdVar2 = (src->m_lhs).m_rhs.
           super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_0>
           .m_data;
  uVar3 = (src->m_lhs).m_rhs.
          super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_0>
          .m_rows.m_value;
  uVar6 = local_98.
          super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows;
  if ((uVar3 != 0) && (uVar6 = uVar3, 3 < uVar3)) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1, 0, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 3, 1>]"
                 );
  }
  local_98.
  super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows = uVar6;
  uVar6 = (ulong)((uint)((ulong)&local_98 >> 3) & 1);
  if (uVar3 <= uVar6) {
    uVar6 = uVar3;
  }
  uVar7 = uVar3 - uVar6;
  if (uVar6 != 0) {
    local_98.
    super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         *pdVar2 * dVar1;
  }
  uVar5 = (uint)(byte)((char)(((byte)((uVar7 & 0xffffffff) >> 7) & 1) + (char)uVar7) >> 1) * 2 |
          uVar6;
  if (1 < (long)uVar7) {
    do {
      dVar4 = (pdVar2 + uVar6)[1];
      *(double *)
       ((long)&local_98.
               super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
               .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data
       + uVar6 * 8) = pdVar2[uVar6] * dVar1;
      *(double *)
       ((long)&local_98.
               super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
               .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data
       + uVar6 * 8 + 8) = dVar4 * dVar1;
      uVar6 = uVar6 + 2;
    } while (uVar6 < uVar5);
  }
  if ((long)uVar5 < (long)uVar3) {
    do {
      *(double *)
       ((long)&local_98.
               super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
               .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data
       + uVar5 * 8) = pdVar2[uVar5] * dVar1;
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  local_98.
  super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhs.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (src->m_rhs).
           super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_data;
  local_98.
  super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhs.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_0>._8_8_
       = *(undefined8 *)
          &(src->m_rhs).
           super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
           .field_0x8;
  local_98.
  super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhs.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_cols.m_value =
       (src->m_rhs).
       super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>.
       super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
       m_cols.m_value;
  local_98.
  super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_innerDim = 1;
  local_98.
  super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhsImpl.
  super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,_1,__1,_1,_1,_3>_>
  .m_data = local_98.
            super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_rhs.
            super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_data;
  local_98.
  super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhsImpl.
  super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,_1,__1,_1,_1,_3>_>
  .m_outerStride.m_value =
       local_98.
       super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_rhs.
       super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>.
       super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
       m_cols.m_value;
  if (((dst->
       super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
       ).
       super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
       .
       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_1>
       .
       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_0>
       .m_rows.m_value == uVar3) &&
     ((dst->
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      ).
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_0>
      .m_cols.m_value ==
      (src->m_rhs).
      super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
      m_cols.m_value)) {
    local_30.
    super_block_evaluator<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
    .
    super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_3,_3>_>
    .m_data = (dst->
              super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
              ).
              super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
              .
              super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_0>
              .m_data;
    local_20.m_dst = &local_30;
    local_98.
    super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>.m_d.
    data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>)
           (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>)&local_98;
    local_20.m_src = &local_98;
    local_20.m_functor = func;
    local_20.m_dstExpr = dst;
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_-1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>_>,_Eigen::internal::sub_assign_op<double,_double>,_0>,_4,_0>
    ::run(&local_20);
    return;
  }
  local_98.
  super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>.m_d.
  data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>)&local_98;
  __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/AssignEvaluator.h"
                ,0x2f2,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Block<Eigen::Block<Eigen::Matrix<double, 3, 3>>>, SrcXprType = Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>, const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 3, 3>, 3, 1, true>, -1, 1>>, Eigen::Map<Eigen::Matrix<double, 1, -1, 1, 1, 3>>, 1>, Functor = Eigen::internal::sub_assign_op<double, double>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}